

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

uint Validator::constraintS7(Solution *solution)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar4;
  Nurse *pNVar5;
  History *this;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar6;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar7;
  Scenario *pSVar8;
  string *psVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  uint local_b4;
  string local_b0;
  string local_90;
  Contract local_70;
  
  pmVar4 = Solution::getNurses_abi_cxx11_(solution);
  p_Var10 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 == p_Var11) {
    local_b4 = 0;
  }
  else {
    local_b4 = 0;
    do {
      pNVar5 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
      this = Nurse::getHistory(pNVar5);
      iVar2 = History::getNumberOfWorkingWeekends(this);
      pvVar6 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
      if ((pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        pvVar6 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
        pvVar7 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
        iVar3 = Turn::getDay(*(Turn **)((long)(pvVar7->
                                              super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                              _M_impl.super__Vector_impl_data._M_finish +
                                       (long)(pvVar6->
                                             super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                             _M_impl.super__Vector_impl_data._M_start +
                                       (-8 - (long)(pvVar7->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)));
        if (iVar3 != 6) {
          pvVar6 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
          pvVar7 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
          iVar3 = Turn::getDay(*(Turn **)((long)(pvVar7->
                                                super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)
                                                ._M_impl.super__Vector_impl_data._M_finish +
                                         (long)(pvVar6->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start +
                                         (-8 - (long)(pvVar7->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)));
          if (iVar3 != 5) goto LAB_00114c68;
        }
        iVar2 = iVar2 + 1;
      }
LAB_00114c68:
      pSVar8 = Scenario::getInstance();
      pNVar5 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
      psVar9 = Nurse::getContract_abi_cxx11_(pNVar5);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + psVar9->_M_string_length);
      Scenario::getContract(&local_70,pSVar8,&local_90);
      iVar3 = Contract::getMaximumNumberOfWorkingWeekends(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.id._M_dataplus._M_p != &local_70.id.field_2) {
        operator_delete(local_70.id._M_dataplus._M_p,local_70.id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 < iVar2) {
        pSVar8 = Scenario::getInstance();
        pNVar5 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
        psVar9 = Nurse::getContract_abi_cxx11_(pNVar5);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (psVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + psVar9->_M_string_length);
        Scenario::getContract(&local_70,pSVar8,&local_b0);
        iVar3 = Contract::getMaximumNumberOfWorkingWeekends(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.id._M_dataplus._M_p != &local_70.id.field_2) {
          operator_delete(local_70.id._M_dataplus._M_p,local_70.id.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_b4 = (iVar2 - iVar3) * 0x1e + local_b4;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var11);
  }
  return local_b4;
}

Assistant:

unsigned int Validator::constraintS7(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfWorkingWeekends = nurse.second->getNurse()->getHistory().getNumberOfWorkingWeekends();


        if(nurse.second->getTurns().size() > 0)
            if(nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 6 || nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 5)
                numberOfWorkingWeekends++;

        if(numberOfWorkingWeekends > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends())
            sum += 30 * (numberOfWorkingWeekends - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends());

    }
    return sum;
}